

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

GraphId absl::lts_20250127::GetGraphId(Mutex *mu)

{
  uint uVar1;
  GraphId GVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = deadlock_graph_mu;
  if ((deadlock_graph_mu & 1) == 0) {
    deadlock_graph_mu = deadlock_graph_mu | 1;
    LOCK();
    UNLOCK();
  }
  if ((uVar1 & 1) != 0) {
    base_internal::SpinLock::SlowLock((SpinLock *)&deadlock_graph_mu);
  }
  GVar2 = GetGraphIdLocked(mu);
  uVar1 = deadlock_graph_mu;
  uVar3 = deadlock_graph_mu & 2;
  LOCK();
  UNLOCK();
  bVar4 = 7 < deadlock_graph_mu;
  deadlock_graph_mu = uVar3;
  if (bVar4) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&deadlock_graph_mu,uVar1);
  }
  return (GraphId)GVar2.handle;
}

Assistant:

ABSL_LOCKS_EXCLUDED(deadlock_graph_mu) {
  deadlock_graph_mu.Lock();
  GraphId id = GetGraphIdLocked(mu);
  deadlock_graph_mu.Unlock();
  return id;
}